

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void __thiscall argo::lexer::throw_number_exception(lexer *this,int c)

{
  json_parser_exception *pjVar1;
  size_t sVar2;
  char local_14;
  int c_local;
  lexer *this_local;
  
  if (c == -1) {
    pjVar1 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
    sVar2 = reader::get_byte_index(this->m_reader);
    json_parser_exception::json_parser_exception(pjVar1,unexpected_eof_e,sVar2);
    __cxa_throw(pjVar1,&json_parser_exception::typeinfo,
                json_parser_exception::~json_parser_exception);
  }
  pjVar1 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
  local_14 = (char)c;
  sVar2 = reader::get_byte_index(this->m_reader);
  json_parser_exception::json_parser_exception(pjVar1,invalid_number_e,local_14,sVar2);
  __cxa_throw(pjVar1,&json_parser_exception::typeinfo,json_parser_exception::~json_parser_exception)
  ;
}

Assistant:

void lexer::throw_number_exception(int c)
{
    if (c == EOF)
    {
        throw json_parser_exception(json_parser_exception::unexpected_eof_e, m_reader.get_byte_index());
    }
    else
    {
        throw json_parser_exception(
                json_parser_exception::invalid_number_e,
                static_cast<char>(c),
                m_reader.get_byte_index());
    }
}